

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int ecp_mod_p448(mbedtls_mpi *N)

{
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  mbedtls_mpi M;
  mbedtls_mpi local_b8;
  mbedtls_mpi_uint Mp [8];
  mbedtls_mpi_uint Qp [7];
  
  uVar4 = N->n;
  iVar2 = 0;
  if (7 < uVar4) {
    M.s = 1;
    M.n = uVar4 - 7;
    iVar2 = -0x4f80;
    if (M.n < 8) {
      M.p = Mp;
      Mp[0] = 0;
      Mp[1] = 0;
      Mp[2] = 0;
      Mp[3] = 0;
      Mp[4] = 0;
      Mp[5] = 0;
      Mp[6] = 0;
      Mp[7] = 0;
      pmVar1 = N->p;
      memcpy(M.p,pmVar1 + 7,M.n * 8);
      for (uVar3 = 7; uVar3 < uVar4; uVar3 = uVar3 + 1) {
        pmVar1[uVar3] = 0;
        uVar4 = N->n;
      }
      iVar2 = mbedtls_mpi_add_mpi(N,N,&M);
      if (iVar2 == 0) {
        local_b8._4_4_ = M._4_4_;
        local_b8.s = M.s;
        local_b8.n = M.n;
        local_b8.p = Qp;
        Qp[0] = Mp[0];
        Qp[1] = Mp[1];
        Qp[2] = Mp[2];
        Qp[3] = Mp[3];
        Qp[4] = Mp[4];
        Qp[5] = Mp[5];
        Qp[6] = Mp[6];
        iVar2 = mbedtls_mpi_shift_r(&local_b8,0xe0);
        if (iVar2 == 0) {
          iVar2 = mbedtls_mpi_add_mpi(N,N,&local_b8);
          if (iVar2 == 0) {
            Mp[3] = Mp[3] & 0xffffffff;
            for (uVar4 = 4; uVar4 < M.n; uVar4 = uVar4 + 1) {
              Mp[uVar4] = 0;
            }
            iVar2 = mbedtls_mpi_add_mpi(&M,&M,&local_b8);
            if (iVar2 == 0) {
              M.n = 8;
              iVar2 = mbedtls_mpi_shift_l(&M,0xe0);
              if (iVar2 == 0) {
                iVar2 = mbedtls_mpi_add_mpi(N,N,&M);
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int ecp_mod_p448( mbedtls_mpi *N )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    mbedtls_mpi M, Q;
    mbedtls_mpi_uint Mp[P448_WIDTH + 1], Qp[P448_WIDTH];

    if( N->n <= P448_WIDTH )
        return( 0 );

    /* M = A1 */
    M.s = 1;
    M.n = N->n - ( P448_WIDTH );
    if( M.n > P448_WIDTH )
        /* Shouldn't be called with N larger than 2^896! */
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
    M.p = Mp;
    memset( Mp, 0, sizeof( Mp ) );
    memcpy( Mp, N->p + P448_WIDTH, M.n * sizeof( mbedtls_mpi_uint ) );

    /* N = A0 */
    for( i = P448_WIDTH; i < N->n; i++ )
        N->p[i] = 0;

    /* N += A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( N, N, &M ) );

    /* Q = B1, N += B1 */
    Q = M;
    Q.p = Qp;
    memcpy( Qp, Mp, sizeof( Qp ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Q, 224 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( N, N, &Q ) );

    /* M = (B0 + B1) * 2^224, N += M */
    if( sizeof( mbedtls_mpi_uint ) > 4 )
        Mp[P224_WIDTH_MIN] &= ( (mbedtls_mpi_uint)-1 ) >> ( P224_UNUSED_BITS );
    for( i = P224_WIDTH_MAX; i < M.n; ++i )
        Mp[i] = 0;
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &M, &M, &Q ) );
    M.n = P448_WIDTH + 1; /* Make room for shifted carry bit from the addition */
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &M, 224 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( N, N, &M ) );

cleanup:
    return( ret );
}